

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void ui_mouse(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ImGuiIO *pIVar4;
  
  iVar2 = (a_app_state->pointer).x;
  bVar1 = (byte)(a_app_state->pointer).buttons;
  iVar3 = (a_app_state->pointer).y;
  pIVar4 = ImGui::GetIO();
  (pIVar4->MousePos).x = (float)iVar2;
  (pIVar4->MousePos).y = (float)iVar3;
  pIVar4->MouseDown[0] = (bool)(bVar1 & 1);
  pIVar4->MouseDown[1] = (bool)(bVar1 >> 1 & 1);
  pIVar4->MouseDown[2] = (bool)(bVar1 >> 2 & 1);
  return;
}

Assistant:

void ui_mouse() {
	const unsigned int btn = a_app_state->pointer.buttons;
	const int x = a_app_state->pointer.x;
	const int y = a_app_state->pointer.y;
	ImGuiIO& io = ImGui::GetIO();
	io.MousePos = ImVec2((float)x, (float)y);
	io.MouseDown[0] = !!(btn & AB_Left);
	io.MouseDown[1] = !!(btn & AB_Right);
	io.MouseDown[2] = !!(btn & AB_Middle);
}